

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buffer,int length,cJSON_bool format)

{
  cJSON_bool cVar1;
  printbuffer local_40;
  
  local_40.depth = 0;
  cVar1 = 0;
  if (buffer != (char *)0x0 && -1 < length) {
    local_40.length = (size_t)(uint)length;
    local_40.offset = 0;
    local_40.noalloc = 1;
    local_40.hooks.allocate = global_hooks.allocate;
    local_40.hooks.deallocate = global_hooks.deallocate;
    local_40.hooks.reallocate = global_hooks.reallocate;
    local_40.buffer = (uchar *)buffer;
    local_40.format = format;
    cVar1 = print_value(item,&local_40);
  }
  return cVar1;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buffer, const int length, const cJSON_bool format)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((length < 0) || (buffer == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buffer;
    p.length = (size_t)length;
    p.offset = 0;
    p.noalloc = true;
    p.format = format;
    p.hooks = global_hooks;

    return print_value(item, &p);
}